

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCollapsePermMap(Abc_Obj_t *pNode,Abc_Obj_t *pSkip,Vec_Ptr_t *vFanins,int *pPerm)

{
  int iVar1;
  Abc_Obj_t *pFanin_00;
  int local_3c;
  int i;
  Abc_Obj_t *pFanin;
  int *pPerm_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pSkip_local;
  Abc_Obj_t *pNode_local;
  
  for (local_3c = 0; iVar1 = Vec_PtrSize(vFanins), local_3c < iVar1; local_3c = local_3c + 1) {
    pPerm[local_3c] = local_3c;
  }
  local_3c = 0;
  do {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 <= local_3c) {
      return 1;
    }
    pFanin_00 = Abc_ObjFanin(pNode,local_3c);
    if (pFanin_00 != pSkip) {
      iVar1 = Abc_ObjFaninNumberNew(vFanins,pFanin_00);
      pPerm[local_3c] = iVar1;
      if (pPerm[local_3c] == -1) {
        return 0;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Abc_NodeCollapsePermMap( Abc_Obj_t * pNode, Abc_Obj_t * pSkip, Vec_Ptr_t * vFanins, int * pPerm )
{
    Abc_Obj_t * pFanin;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanins); i++ )
        pPerm[i] = i;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin == pSkip )
            continue;
        pPerm[i] = Abc_ObjFaninNumberNew( vFanins, pFanin );
        if ( pPerm[i] == -1 )
            return 0;
    }
    return 1;
}